

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O2

void __thiscall
despot::PlannerBase::PlannerBase
          (PlannerBase *this,string *lower_bounds_str,string *base_lower_bounds_str,
          string *upper_bounds_str,string *base_upper_bounds_str)

{
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  this->_vptr_PlannerBase = (_func_int **)&PTR__PlannerBase_0019bec8;
  std::__cxx11::string::string((string *)&local_40,(string *)lower_bounds_str);
  std::__cxx11::string::string((string *)&local_60,(string *)base_lower_bounds_str);
  std::__cxx11::string::string((string *)&local_80,(string *)upper_bounds_str);
  std::__cxx11::string::string((string *)&local_a0,(string *)base_upper_bounds_str);
  BuildUsage(&local_40,&local_60,&local_80,&local_a0);
  this->usage = BuildUsage::usage;
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

PlannerBase::PlannerBase(string lower_bounds_str, string base_lower_bounds_str,
		string upper_bounds_str, string base_upper_bounds_str) {
	usage = BuildUsage(lower_bounds_str, base_lower_bounds_str,
			upper_bounds_str, base_upper_bounds_str);
}